

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.hh
# Opt level: O2

integer_t * __thiscall tchecker::vm_t::slot_of(vm_t *this,bytecode_t id)

{
  _Rb_tree<long,_std::pair<const_long,_int>,_std::_Select1st<std::pair<const_long,_int>_>,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>
  *p_Var1;
  iterator iVar2;
  out_of_range *this_00;
  _Rb_tree<long,_std::pair<const_long,_int>,_std::_Select1st<std::pair<const_long,_int>_>,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>
  *p_Var3;
  bytecode_t id_local;
  
  p_Var3 = &((this->_frames).
             super__Vector_base<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_t;
  id_local = id;
  do {
    if (p_Var3 == &((this->_frames).
                    super__Vector_base<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>,_std::allocator<std::map<long,_int,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_t) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this_00,"unknown local variable ID");
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    iVar2 = std::
            _Rb_tree<long,_std::pair<const_long,_int>,_std::_Select1st<std::pair<const_long,_int>_>,_std::less<long>,_std::allocator<std::pair<const_long,_int>_>_>
            ::find(p_Var3 + -1,&id_local);
    p_Var1 = p_Var3 + -1;
    p_Var3 = p_Var3 + -1;
  } while ((_Rb_tree_header *)iVar2._M_node == &(p_Var1->_M_impl).super__Rb_tree_header);
  return (integer_t *)&iVar2._M_node[1]._M_parent;
}

Assistant:

tchecker::integer_t & slot_of(tchecker::bytecode_t id)
  {
    for (auto it = _frames.rbegin(); it != _frames.rend(); ++it) {
      auto kv = it->find(id);
      if (kv != it->end())
        return kv->second;
    }
    throw std::out_of_range("unknown local variable ID");
  }